

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

bool deqp::gls::pixelNeighborhoodContainsColor
               (Surface *target,int x,int y,RGBA *color,IVec3 *compareThreshold)

{
  bool bVar1;
  RGBA local_3c;
  int local_38;
  RGBA targetCmpPixel;
  int dx;
  int dy;
  IVec3 *compareThreshold_local;
  RGBA *color_local;
  int y_local;
  int x_local;
  Surface *target_local;
  
  targetCmpPixel.m_value = 0xffffffff;
  do {
    if (1 < (int)targetCmpPixel.m_value) {
      return false;
    }
    for (local_38 = -1; local_38 < 2; local_38 = local_38 + 1) {
      local_3c = tcu::Surface::getPixel(target,x + local_38,y + targetCmpPixel.m_value);
      bVar1 = colorsEqual(color,&local_3c,compareThreshold);
      if (bVar1) {
        return true;
      }
    }
    targetCmpPixel.m_value = targetCmpPixel.m_value + 1;
  } while( true );
}

Assistant:

static bool pixelNeighborhoodContainsColor (const tcu::Surface& target, int x, int y, const tcu::RGBA& color, const tcu::IVec3& compareThreshold)
{
	// should not be called for edge pixels
	DE_ASSERT(x >= 1 && x <= target.getWidth()-2);
	DE_ASSERT(y >= 1 && y <= target.getHeight()-2);

	for (int dy = -1; dy < 2; dy++)
	for (int dx = -1; dx < 2; dx++)
	{
		const tcu::RGBA	targetCmpPixel = target.getPixel(x+dx, y+dy);
		if (colorsEqual(color, targetCmpPixel, compareThreshold))
			return true;
	}

	return false;
}